

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eternal.hpp
# Opt level: O3

pair<mapbox::eternal::iterator<mapbox::eternal::impl::element<tinyusdz::crate::CrateDataTypeId,_bool>_>,_mapbox::eternal::iterator<mapbox::eternal::impl::element<tinyusdz::crate::CrateDataTypeId,_bool>_>_>
 __thiscall
mapbox::eternal::impl::
map<mapbox::eternal::impl::element<tinyusdz::crate::CrateDataTypeId,_bool>,_31UL>::equal_range
          (map<mapbox::eternal::impl::element<tinyusdz::crate::CrateDataTypeId,_bool>,_31UL> *this,
          key_type *key)

{
  iterator<mapbox::eternal::impl::element<tinyusdz::crate::CrateDataTypeId,_bool>_> iVar1;
  ulong uVar2;
  iterator<mapbox::eternal::impl::element<tinyusdz::crate::CrateDataTypeId,_bool>_> iVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  pair<mapbox::eternal::iterator<mapbox::eternal::impl::element<tinyusdz::crate::CrateDataTypeId,_bool>_>,_mapbox::eternal::iterator<mapbox::eternal::impl::element<tinyusdz::crate::CrateDataTypeId,_bool>_>_>
  pVar7;
  
  uVar2 = 0x1f;
  iVar1.pos = this->data_;
  do {
    uVar4 = uVar2 >> 1;
    uVar6 = ~uVar4 + uVar2;
    lVar5 = (long)((map<mapbox::eternal::impl::element<tinyusdz::crate::CrateDataTypeId,_bool>,_31UL>
                    *)iVar1.pos)->data_ + uVar4 * 8;
    uVar2 = uVar4;
    if (*(int *)lVar5 < (int)*key) {
      iVar1.pos = (element<tinyusdz::crate::CrateDataTypeId,_bool> *)(lVar5 + 8);
      uVar2 = uVar6;
    }
  } while (uVar2 != 0);
  lVar5 = (long)this + (0xf8 - (long)iVar1.pos);
  iVar3.pos = iVar1.pos;
  if (lVar5 != 0) {
    uVar2 = lVar5 >> 3;
    do {
      uVar4 = uVar2 >> 1;
      uVar6 = ~uVar4 + uVar2;
      lVar5 = (long)((map<mapbox::eternal::impl::element<tinyusdz::crate::CrateDataTypeId,_bool>,_31UL>
                      *)iVar3.pos)->data_ + uVar4 * 8;
      uVar2 = uVar4;
      if (*(int *)lVar5 <= (int)*key) {
        iVar3.pos = (element<tinyusdz::crate::CrateDataTypeId,_bool> *)(lVar5 + 8);
        uVar2 = uVar6;
      }
    } while (uVar2 != 0);
  }
  pVar7.second.pos = iVar3.pos;
  pVar7.first.pos = iVar1.pos;
  return pVar7;
}

Assistant:

constexpr compare_key(const Key& key_) noexcept : key(key_) {
    }